

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_ai_way.cxx
# Opt level: O2

void __thiscall xray_re::way_path_io::operator()(way_path_io *this,way_path *path,xr_writer *w)

{
  undefined8 in_RAX;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX;
  xr_writer::w_chunk<unsigned_short>(w,1,&WAYOBJECT_VERSION);
  xr_writer::open_chunk(w,2);
  uStack_28._0_6_ =
       CONCAT24((short)(((long)(path->points).
                               super__Vector_base<xray_re::way_point,_std::allocator<xray_re::way_point>_>
                               ._M_impl.super__Vector_impl_data._M_finish -
                        (long)(path->points).
                              super__Vector_base<xray_re::way_point,_std::allocator<xray_re::way_point>_>
                              ._M_impl.super__Vector_impl_data._M_start) / 0x30),
                (undefined4)uStack_28);
  (*w->_vptr_xr_writer[2])(w,(long)&uStack_28 + 4,2);
  xr_writer::
  w_seq<std::vector<xray_re::way_point,std::allocator<xray_re::way_point>>,xray_re::way_point_io>
            (w,&path->points);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,3);
  uStack_28 = CONCAT26((short)((uint)(*(int *)&(path->links).
                                               super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>
                                               ._M_impl.super__Vector_impl_data._M_finish -
                                     *(int *)&(path->links).
                                              super__Vector_base<xray_re::way_link,_std::allocator<xray_re::way_link>_>
                                              ._M_impl.super__Vector_impl_data._M_start) >> 3),
                       (undefined6)uStack_28);
  (*w->_vptr_xr_writer[2])(w,(long)&uStack_28 + 6,2);
  xr_writer::
  w_seq<std::vector<xray_re::way_link,std::allocator<xray_re::way_link>>,xray_re::way_link_io>
            (w,&path->links);
  xr_writer::close_chunk(w);
  xr_writer::open_chunk(w,5);
  xr_writer::w_sz(w,&path->name);
  xr_writer::close_chunk(w);
  return;
}

Assistant:

void way_path_io::operator()(const way_path* path, xr_writer& w) const
{
	w.w_chunk<uint16_t>(WAYOBJECT_CHUNK_VERSION, WAYOBJECT_VERSION);

	w.open_chunk(WAYOBJECT_CHUNK_POINTS);
	w.w_size_u16(path->points.size());
	w.w_seq(path->points, way_point_io());
	w.close_chunk();

	w.open_chunk(WAYOBJECT_CHUNK_LINKS);
	w.w_size_u16(path->links.size());
	w.w_seq(path->links, way_link_io());
	w.close_chunk();

	w.open_chunk(WAYOBJECT_CHUNK_NAME);
	w.w_sz(path->name);
	w.close_chunk();
}